

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceArrayIntersector1MB>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  byte bVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 (*pauVar18) [16];
  undefined1 (*pauVar19) [16];
  AABBNodeMB4D *node1;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  long lVar25;
  undefined1 (*pauVar26) [16];
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  Primitive *prim;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ulong uVar39;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  Precalculations pre;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_24d1;
  ulong local_24d0;
  ulong local_24c8;
  RayHit *local_24c0;
  RayQueryContext *local_24b8;
  long local_24b0;
  ulong local_24a8;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    pauVar19 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar5 = (ray->super_RayK<1>).dir.field_0;
    auVar40 = ZEXT816(0) << 0x40;
    auVar44 = ZEXT1664(auVar40);
    auVar33 = vmaxss_avx(auVar40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    fVar3 = (ray->super_RayK<1>).tfar;
    auVar36 = ZEXT464((uint)fVar3);
    auVar37 = vmaxss_avx(auVar40,ZEXT416((uint)fVar3));
    auVar40._8_4_ = 0x7fffffff;
    auVar40._0_8_ = 0x7fffffff7fffffff;
    auVar40._12_4_ = 0x7fffffff;
    auVar40 = vandps_avx((undefined1  [16])aVar5,auVar40);
    auVar53._8_4_ = 0x219392ef;
    auVar53._0_8_ = 0x219392ef219392ef;
    auVar53._12_4_ = 0x219392ef;
    auVar40 = vcmpps_avx(auVar40,auVar53,1);
    auVar40 = vblendvps_avx((undefined1  [16])aVar5,auVar53,auVar40);
    auVar53 = vrcpps_avx(auVar40);
    fVar3 = auVar53._0_4_;
    auVar45._0_4_ = auVar40._0_4_ * fVar3;
    fVar8 = auVar53._4_4_;
    auVar45._4_4_ = auVar40._4_4_ * fVar8;
    fVar9 = auVar53._8_4_;
    auVar45._8_4_ = auVar40._8_4_ * fVar9;
    fVar10 = auVar53._12_4_;
    auVar45._12_4_ = auVar40._12_4_ * fVar10;
    auVar54._8_4_ = 0x3f800000;
    auVar54._0_8_ = 0x3f8000003f800000;
    auVar54._12_4_ = 0x3f800000;
    auVar40 = vsubps_avx(auVar54,auVar45);
    uVar4 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23c0._4_4_ = uVar4;
    local_23c0._0_4_ = uVar4;
    local_23c0._8_4_ = uVar4;
    local_23c0._12_4_ = uVar4;
    local_23c0._16_4_ = uVar4;
    local_23c0._20_4_ = uVar4;
    local_23c0._24_4_ = uVar4;
    local_23c0._28_4_ = uVar4;
    auVar55 = ZEXT3264(local_23c0);
    uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_23e0._4_4_ = uVar4;
    local_23e0._0_4_ = uVar4;
    local_23e0._8_4_ = uVar4;
    local_23e0._12_4_ = uVar4;
    local_23e0._16_4_ = uVar4;
    local_23e0._20_4_ = uVar4;
    local_23e0._24_4_ = uVar4;
    local_23e0._28_4_ = uVar4;
    auVar56 = ZEXT3264(local_23e0);
    auVar46._0_4_ = fVar3 + fVar3 * auVar40._0_4_;
    auVar46._4_4_ = fVar8 + fVar8 * auVar40._4_4_;
    auVar46._8_4_ = fVar9 + fVar9 * auVar40._8_4_;
    auVar46._12_4_ = fVar10 + fVar10 * auVar40._12_4_;
    uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2400._4_4_ = uVar4;
    local_2400._0_4_ = uVar4;
    local_2400._8_4_ = uVar4;
    local_2400._12_4_ = uVar4;
    local_2400._16_4_ = uVar4;
    local_2400._20_4_ = uVar4;
    local_2400._24_4_ = uVar4;
    local_2400._28_4_ = uVar4;
    auVar57 = ZEXT3264(local_2400);
    auVar40 = vshufps_avx(auVar46,auVar46,0);
    local_2420._16_16_ = auVar40;
    local_2420._0_16_ = auVar40;
    auVar58 = ZEXT3264(local_2420);
    auVar40 = vmovshdup_avx(auVar46);
    auVar52 = ZEXT1664(auVar40);
    auVar53 = vshufps_avx(auVar46,auVar46,0x55);
    local_2440._16_16_ = auVar53;
    local_2440._0_16_ = auVar53;
    auVar59 = ZEXT3264(local_2440);
    auVar53 = vshufpd_avx(auVar46,auVar46,1);
    auVar45 = vshufps_avx(auVar46,auVar46,0xaa);
    auVar50 = ZEXT1664(auVar45);
    uVar28 = (ulong)(auVar46._0_4_ < 0.0) << 5;
    uVar29 = (ulong)(auVar40._0_4_ < 0.0) << 5 | 0x40;
    local_2460._16_16_ = auVar45;
    local_2460._0_16_ = auVar45;
    auVar60 = ZEXT3264(local_2460);
    local_24a8 = (ulong)(auVar53._0_4_ < 0.0) << 5 | 0x80;
    uVar30 = uVar28 ^ 0x20;
    uVar31 = uVar29 ^ 0x20;
    uVar24 = local_24a8 ^ 0x20;
    auVar40 = vshufps_avx(auVar33,auVar33,0);
    local_2480._16_16_ = auVar40;
    local_2480._0_16_ = auVar40;
    auVar61 = ZEXT3264(local_2480);
    auVar40 = vshufps_avx(auVar37,auVar37,0);
    auVar32 = ZEXT3264(CONCAT1616(auVar40,auVar40));
    local_24b8 = context;
    local_24c0 = ray;
    local_24c8 = uVar28;
    local_24d0 = uVar29;
LAB_014e6079:
    do {
      pauVar18 = pauVar19 + -1;
      pauVar19 = pauVar19 + -1;
      if (*(float *)(*pauVar18 + 8) <= auVar36._0_4_) {
        pauVar18 = pauVar19;
        uVar39 = *(ulong *)*pauVar19;
        while (pauVar19 = pauVar18, (uVar39 & 8) == 0) {
          uVar20 = uVar39 & 0xfffffffffffffff0;
          fVar3 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar38._4_4_ = fVar3;
          auVar38._0_4_ = fVar3;
          auVar38._8_4_ = fVar3;
          auVar38._12_4_ = fVar3;
          auVar38._16_4_ = fVar3;
          auVar38._20_4_ = fVar3;
          auVar38._24_4_ = fVar3;
          auVar38._28_4_ = fVar3;
          pfVar2 = (float *)(uVar20 + 0x100 + uVar28);
          pfVar1 = (float *)(uVar20 + 0x40 + uVar28);
          auVar35._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar35._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar35._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar35._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar35._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar35._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar35._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar35._28_4_ = auVar36._28_4_ + pfVar1[7];
          auVar35 = vsubps_avx(auVar35,auVar55._0_32_);
          auVar11._4_4_ = auVar58._4_4_ * auVar35._4_4_;
          auVar11._0_4_ = auVar58._0_4_ * auVar35._0_4_;
          auVar11._8_4_ = auVar58._8_4_ * auVar35._8_4_;
          auVar11._12_4_ = auVar58._12_4_ * auVar35._12_4_;
          auVar11._16_4_ = auVar58._16_4_ * auVar35._16_4_;
          auVar11._20_4_ = auVar58._20_4_ * auVar35._20_4_;
          auVar11._24_4_ = auVar58._24_4_ * auVar35._24_4_;
          auVar11._28_4_ = auVar35._28_4_;
          auVar35 = vmaxps_avx(auVar61._0_32_,auVar11);
          pfVar2 = (float *)(uVar20 + 0x100 + uVar29);
          pfVar1 = (float *)(uVar20 + 0x40 + uVar29);
          auVar42._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar42._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar42._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar42._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar42._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar42._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar42._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar42._28_4_ = auVar44._28_4_ + pfVar1[7];
          auVar11 = vsubps_avx(auVar42,auVar56._0_32_);
          auVar14._4_4_ = auVar59._4_4_ * auVar11._4_4_;
          auVar14._0_4_ = auVar59._0_4_ * auVar11._0_4_;
          auVar14._8_4_ = auVar59._8_4_ * auVar11._8_4_;
          auVar14._12_4_ = auVar59._12_4_ * auVar11._12_4_;
          auVar14._16_4_ = auVar59._16_4_ * auVar11._16_4_;
          auVar14._20_4_ = auVar59._20_4_ * auVar11._20_4_;
          auVar14._24_4_ = auVar59._24_4_ * auVar11._24_4_;
          auVar14._28_4_ = auVar11._28_4_;
          pfVar2 = (float *)(uVar20 + 0x100 + local_24a8);
          pfVar1 = (float *)(uVar20 + 0x40 + local_24a8);
          auVar48._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar48._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar48._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar48._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar48._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar48._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar48._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar48._28_4_ = auVar50._28_4_ + pfVar1[7];
          auVar12 = vsubps_avx(auVar48,auVar57._0_32_);
          auVar15._4_4_ = auVar60._4_4_ * auVar12._4_4_;
          auVar15._0_4_ = auVar60._0_4_ * auVar12._0_4_;
          auVar15._8_4_ = auVar60._8_4_ * auVar12._8_4_;
          auVar15._12_4_ = auVar60._12_4_ * auVar12._12_4_;
          auVar15._16_4_ = auVar60._16_4_ * auVar12._16_4_;
          auVar15._20_4_ = auVar60._20_4_ * auVar12._20_4_;
          auVar15._24_4_ = auVar60._24_4_ * auVar12._24_4_;
          auVar15._28_4_ = auVar12._28_4_;
          auVar11 = vmaxps_avx(auVar14,auVar15);
          local_24a0 = vmaxps_avx(auVar35,auVar11);
          pfVar2 = (float *)(uVar20 + 0x100 + uVar30);
          pfVar1 = (float *)(uVar20 + 0x40 + uVar30);
          auVar43._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar43._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar43._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar43._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar43._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar43._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar43._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar43._28_4_ = auVar11._28_4_ + pfVar1[7];
          auVar35 = vsubps_avx(auVar43,auVar55._0_32_);
          auVar16._4_4_ = auVar58._4_4_ * auVar35._4_4_;
          auVar16._0_4_ = auVar58._0_4_ * auVar35._0_4_;
          auVar16._8_4_ = auVar58._8_4_ * auVar35._8_4_;
          auVar16._12_4_ = auVar58._12_4_ * auVar35._12_4_;
          auVar16._16_4_ = auVar58._16_4_ * auVar35._16_4_;
          auVar16._20_4_ = auVar58._20_4_ * auVar35._20_4_;
          auVar16._24_4_ = auVar58._24_4_ * auVar35._24_4_;
          auVar16._28_4_ = auVar35._28_4_;
          pfVar2 = (float *)(uVar20 + 0x100 + uVar31);
          pfVar1 = (float *)(uVar20 + 0x40 + uVar31);
          auVar49._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar49._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar49._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar49._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar49._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar49._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar49._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar49._28_4_ = auVar12._28_4_ + pfVar1[7];
          auVar35 = vsubps_avx(auVar49,auVar56._0_32_);
          auVar12._4_4_ = auVar59._4_4_ * auVar35._4_4_;
          auVar12._0_4_ = auVar59._0_4_ * auVar35._0_4_;
          auVar12._8_4_ = auVar59._8_4_ * auVar35._8_4_;
          auVar12._12_4_ = auVar59._12_4_ * auVar35._12_4_;
          auVar12._16_4_ = auVar59._16_4_ * auVar35._16_4_;
          auVar12._20_4_ = auVar59._20_4_ * auVar35._20_4_;
          auVar12._24_4_ = auVar59._24_4_ * auVar35._24_4_;
          auVar12._28_4_ = auVar35._28_4_;
          pfVar2 = (float *)(uVar20 + 0x100 + uVar24);
          pfVar1 = (float *)(uVar20 + 0x40 + uVar24);
          auVar51._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar51._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar51._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar51._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar51._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar51._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar51._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar51._28_4_ = auVar52._28_4_ + pfVar1[7];
          auVar35 = vsubps_avx(auVar51,auVar57._0_32_);
          auVar17._4_4_ = auVar60._4_4_ * auVar35._4_4_;
          auVar17._0_4_ = auVar60._0_4_ * auVar35._0_4_;
          auVar17._8_4_ = auVar60._8_4_ * auVar35._8_4_;
          auVar17._12_4_ = auVar60._12_4_ * auVar35._12_4_;
          auVar17._16_4_ = auVar60._16_4_ * auVar35._16_4_;
          auVar17._20_4_ = auVar60._20_4_ * auVar35._20_4_;
          auVar17._24_4_ = auVar60._24_4_ * auVar35._24_4_;
          auVar17._28_4_ = auVar35._28_4_;
          auVar52 = ZEXT3264(auVar17);
          auVar11 = vminps_avx(auVar12,auVar17);
          auVar35 = vminps_avx(auVar32._0_32_,auVar16);
          auVar35 = vminps_avx(auVar35,auVar11);
          auVar35 = vcmpps_avx(local_24a0,auVar35,2);
          if (((uint)uVar39 & 7) == 6) {
            auVar11 = vcmpps_avx(*(undefined1 (*) [32])(uVar20 + 0x1c0),auVar38,2);
            auVar12 = vcmpps_avx(auVar38,*(undefined1 (*) [32])(uVar20 + 0x1e0),1);
            auVar12 = vandps_avx(auVar11,auVar12);
            auVar35 = vandps_avx(auVar12,auVar35);
            auVar40 = vpackssdw_avx(auVar35._0_16_,auVar35._16_16_);
          }
          else {
            auVar40 = vpackssdw_avx(auVar35._0_16_,auVar35._16_16_);
          }
          auVar50 = ZEXT3264(auVar11);
          auVar40 = vpsllw_avx(auVar40,0xf);
          auVar44 = ZEXT1664(auVar40);
          if ((((((((auVar40 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar40 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar40 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar40 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar40 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar40 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar40 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar40[0xf]) {
            auVar40 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                             ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar36 = ZEXT1664(auVar40);
            if (pauVar19 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_014e6079;
          }
          auVar40 = vpacksswb_avx(auVar40,auVar40);
          auVar36 = ZEXT1664(auVar40);
          bVar13 = SUB161(auVar40 >> 7,0) & 1 | (SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar40 >> 0x17,0) & 1) << 2 | (SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar40 >> 0x27,0) & 1) << 4 | (SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar40 >> 0x37,0) & 1) << 6 | SUB161(auVar40 >> 0x3f,0) << 7;
          lVar21 = 0;
          if (bVar13 != 0) {
            for (; (bVar13 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
            }
          }
          uVar39 = *(ulong *)(uVar20 + lVar21 * 8);
          uVar27 = bVar13 - 1 & (uint)bVar13;
          pauVar18 = pauVar19;
          if (uVar27 != 0) {
            uVar6 = *(uint *)(local_24a0 + lVar21 * 4);
            lVar21 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
            uVar22 = *(ulong *)(uVar20 + lVar21 * 8);
            uVar7 = *(uint *)(local_24a0 + lVar21 * 4);
            uVar27 = uVar27 - 1 & uVar27;
            uVar28 = local_24c8;
            uVar29 = local_24d0;
            if (uVar27 == 0) {
              pauVar18 = pauVar19 + 1;
              if (uVar6 < uVar7) {
                *(ulong *)*pauVar19 = uVar22;
                *(uint *)(*pauVar19 + 8) = uVar7;
              }
              else {
                *(ulong *)*pauVar19 = uVar39;
                *(uint *)(*pauVar19 + 8) = uVar6;
                uVar39 = uVar22;
              }
            }
            else {
              auVar33._8_8_ = 0;
              auVar33._0_8_ = uVar39;
              auVar40 = vpunpcklqdq_avx(auVar33,ZEXT416(uVar6));
              auVar37._8_8_ = 0;
              auVar37._0_8_ = uVar22;
              auVar33 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar7));
              lVar21 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                }
              }
              auVar41._8_8_ = 0;
              auVar41._0_8_ = *(ulong *)(uVar20 + lVar21 * 8);
              auVar37 = vpunpcklqdq_avx(auVar41,ZEXT416(*(uint *)(local_24a0 + lVar21 * 4)));
              auVar44 = ZEXT1664(auVar37);
              uVar27 = uVar27 - 1 & uVar27;
              if (uVar27 == 0) {
                auVar53 = vpcmpgtd_avx(auVar33,auVar40);
                auVar45 = vpshufd_avx(auVar53,0xaa);
                auVar53 = vblendvps_avx(auVar33,auVar40,auVar45);
                auVar40 = vblendvps_avx(auVar40,auVar33,auVar45);
                auVar33 = vpcmpgtd_avx(auVar37,auVar53);
                auVar45 = vpshufd_avx(auVar33,0xaa);
                auVar33 = vblendvps_avx(auVar37,auVar53,auVar45);
                auVar50 = ZEXT1664(auVar33);
                auVar37 = vblendvps_avx(auVar53,auVar37,auVar45);
                auVar53 = vpcmpgtd_avx(auVar37,auVar40);
                auVar45 = vpshufd_avx(auVar53,0xaa);
                auVar44 = ZEXT1664(auVar45);
                auVar53 = vblendvps_avx(auVar37,auVar40,auVar45);
                auVar52 = ZEXT1664(auVar53);
                auVar40 = vblendvps_avx(auVar40,auVar37,auVar45);
                auVar36 = ZEXT1664(auVar40);
                *pauVar19 = auVar40;
                pauVar19[1] = auVar53;
                uVar39 = auVar33._0_8_;
                pauVar18 = pauVar19 + 2;
              }
              else {
                lVar21 = 0;
                if (uVar27 != 0) {
                  for (; (uVar27 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                  }
                }
                auVar52 = ZEXT464(*(uint *)(local_24a0 + lVar21 * 4));
                auVar47._8_8_ = 0;
                auVar47._0_8_ = *(ulong *)(uVar20 + lVar21 * 8);
                auVar53 = vpunpcklqdq_avx(auVar47,ZEXT416(*(uint *)(local_24a0 + lVar21 * 4)));
                auVar50 = ZEXT1664(auVar53);
                uVar27 = uVar27 - 1 & uVar27;
                uVar22 = (ulong)uVar27;
                if (uVar27 == 0) {
                  auVar45 = vpcmpgtd_avx(auVar33,auVar40);
                  auVar46 = vpshufd_avx(auVar45,0xaa);
                  auVar45 = vblendvps_avx(auVar33,auVar40,auVar46);
                  auVar40 = vblendvps_avx(auVar40,auVar33,auVar46);
                  auVar33 = vpcmpgtd_avx(auVar53,auVar37);
                  auVar46 = vpshufd_avx(auVar33,0xaa);
                  auVar33 = vblendvps_avx(auVar53,auVar37,auVar46);
                  auVar37 = vblendvps_avx(auVar37,auVar53,auVar46);
                  auVar53 = vpcmpgtd_avx(auVar37,auVar40);
                  auVar46 = vpshufd_avx(auVar53,0xaa);
                  auVar53 = vblendvps_avx(auVar37,auVar40,auVar46);
                  auVar50 = ZEXT1664(auVar53);
                  auVar40 = vblendvps_avx(auVar40,auVar37,auVar46);
                  auVar36 = ZEXT1664(auVar40);
                  auVar37 = vpcmpgtd_avx(auVar33,auVar45);
                  auVar46 = vpshufd_avx(auVar37,0xaa);
                  auVar37 = vblendvps_avx(auVar33,auVar45,auVar46);
                  auVar44 = ZEXT1664(auVar37);
                  auVar33 = vblendvps_avx(auVar45,auVar33,auVar46);
                  auVar45 = vpcmpgtd_avx(auVar53,auVar33);
                  auVar46 = vpshufd_avx(auVar45,0xaa);
                  auVar52 = ZEXT1664(auVar46);
                  auVar45 = vblendvps_avx(auVar53,auVar33,auVar46);
                  auVar33 = vblendvps_avx(auVar33,auVar53,auVar46);
                  *pauVar19 = auVar40;
                  pauVar19[1] = auVar33;
                  pauVar19[2] = auVar45;
                  uVar39 = auVar37._0_8_;
                  pauVar18 = pauVar19 + 3;
                }
                else {
                  *pauVar19 = auVar40;
                  pauVar19[1] = auVar33;
                  pauVar19[2] = auVar37;
                  pauVar19[3] = auVar53;
                  lVar21 = 0x30;
                  do {
                    lVar25 = lVar21;
                    lVar21 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                      }
                    }
                    uVar39 = *(ulong *)(uVar20 + lVar21 * 8);
                    auVar34._8_8_ = 0;
                    auVar34._0_8_ = uVar39;
                    auVar40 = vpunpcklqdq_avx(auVar34,ZEXT416(*(uint *)(local_24a0 + lVar21 * 4)));
                    auVar36 = ZEXT1664(auVar40);
                    *(undefined1 (*) [16])(pauVar19[1] + lVar25) = auVar40;
                    uVar22 = uVar22 & uVar22 - 1;
                    lVar21 = lVar25 + 0x10;
                  } while (uVar22 != 0);
                  pauVar18 = (undefined1 (*) [16])(pauVar19[1] + lVar25);
                  if (lVar25 + 0x10 != 0) {
                    lVar21 = 0x10;
                    pauVar23 = pauVar19;
                    do {
                      auVar40 = pauVar23[1];
                      auVar36 = ZEXT1664(auVar40);
                      pauVar23 = pauVar23 + 1;
                      uVar27 = vextractps_avx(auVar40,2);
                      lVar25 = lVar21;
                      do {
                        if (uVar27 <= *(uint *)(pauVar19[-1] + lVar25 + 8)) {
                          pauVar26 = (undefined1 (*) [16])(*pauVar19 + lVar25);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar19 + lVar25) =
                             *(undefined1 (*) [16])(pauVar19[-1] + lVar25);
                        lVar25 = lVar25 + -0x10;
                        pauVar26 = pauVar19;
                      } while (lVar25 != 0);
                      *pauVar26 = auVar40;
                      lVar21 = lVar21 + 0x10;
                    } while (pauVar18 != pauVar23);
                    uVar39 = *(ulong *)*pauVar18;
                  }
                }
              }
            }
          }
        }
        local_24b0 = (ulong)((uint)uVar39 & 0xf) - 8;
        if (local_24b0 != 0) {
          prim = (Primitive *)(uVar39 & 0xfffffffffffffff0);
          do {
            auVar44 = ZEXT1664(auVar44._0_16_);
            auVar50 = ZEXT1664(auVar50._0_16_);
            auVar52 = ZEXT1664(auVar52._0_16_);
            InstanceArrayIntersector1MB::intersect(&local_24d1,ray,context,prim);
            prim = prim + 1;
            local_24b0 = local_24b0 + -1;
            context = local_24b8;
            ray = local_24c0;
          } while (local_24b0 != 0);
        }
        fVar3 = (ray->super_RayK<1>).tfar;
        auVar32 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,CONCAT412
                                                  (fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))))))))
        ;
        auVar36 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar55 = ZEXT3264(local_23c0);
        auVar56 = ZEXT3264(local_23e0);
        auVar57 = ZEXT3264(local_2400);
        auVar58 = ZEXT3264(local_2420);
        auVar59 = ZEXT3264(local_2440);
        auVar60 = ZEXT3264(local_2460);
        auVar61 = ZEXT3264(local_2480);
        uVar28 = local_24c8;
        uVar29 = local_24d0;
      }
    } while (pauVar19 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }